

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc.c
# Opt level: O3

void ipc_pipe_recv_cb(void *arg)

{
  nni_mtx *mtx;
  nni_msg *pnVar1;
  undefined8 uVar2;
  nng_err result;
  int iVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  nni_aio *pnVar6;
  size_t sVar7;
  ulong sz;
  undefined1 auStack_78 [8];
  char peer [64];
  int pid;
  
  pnVar6 = (nni_aio *)((long)arg + 0x270);
  mtx = (nni_mtx *)((long)arg + 0x608);
  nni_mtx_lock(mtx);
  result = nni_aio_result(pnVar6);
  if (result == NNG_OK) {
    sVar7 = nni_aio_count(pnVar6);
    nni_aio_iov_advance(pnVar6,sVar7);
    sVar7 = nni_aio_iov_count(pnVar6);
    if (sVar7 != 0) {
      nng_stream_recv(*arg,pnVar6);
      nni_mtx_unlock(mtx);
      return;
    }
    if (*(long *)((long)arg + 0x600) != 0) {
LAB_00124b41:
      pnVar6 = (nni_aio *)nni_list_first((nni_list *)((long)arg + 0x78));
      nni_aio_list_remove(pnVar6);
      pnVar1 = *(nni_msg **)((long)arg + 0x600);
      *(undefined8 *)((long)arg + 0x600) = 0;
      sVar7 = nni_msg_len(pnVar1);
      nni_pipe_bump_rx(*(nni_pipe **)((long)arg + 0x28),sVar7);
      ipc_pipe_recv_start((ipc_pipe *)arg);
      nni_mtx_unlock(mtx);
      nni_aio_set_msg(pnVar6,pnVar1);
      nni_aio_finish_sync(pnVar6,NNG_OK,sVar7);
      return;
    }
    result = NNG_EPROTO;
    if (*(char *)((long)arg + 0x49) == '\x01') {
      sz = (ulong)*(byte *)((long)arg + 0x51) +
           ((ulong)*(byte *)((long)arg + 0x50) << 8 |
           (ulong)*(byte *)((long)arg + 0x4f) << 0x10 |
           (ulong)*(byte *)((long)arg + 0x4e) << 0x18 |
           (ulong)*(byte *)((long)arg + 0x4d) << 0x20 |
           (ulong)*(byte *)((long)arg + 0x4c) << 0x28 |
           (ulong)*(byte *)((long)arg + 0x4b) << 0x30 | (ulong)*(byte *)((long)arg + 0x4a) << 0x38);
      if ((*(ulong *)((long)arg + 0x10) == 0) || (sz <= *(ulong *)((long)arg + 0x10))) {
        result = nni_msg_alloc((nni_msg **)((long)arg + 0x600),sz);
        if (result == NNG_OK) {
          if (sz != 0) {
            auStack_78 = (undefined1  [8])nni_msg_body(*(nni_msg **)((long)arg + 0x600));
            peer._0_8_ = sz;
            nni_aio_set_iov(pnVar6,1,(nni_iov *)auStack_78);
            nng_stream_recv(*arg,pnVar6);
            nni_mtx_unlock(mtx);
            return;
          }
          goto LAB_00124b41;
        }
      }
      else {
        peer[0x28] = '\0';
        peer[0x29] = '\0';
        peer[0x2a] = '\0';
        peer[0x2b] = '\0';
        peer[0x2c] = '\0';
        peer[0x2d] = '\0';
        peer[0x2e] = '\0';
        peer[0x2f] = '\0';
        peer[0x30] = '\0';
        peer[0x31] = '\0';
        peer[0x32] = '\0';
        peer[0x33] = '\0';
        peer[0x34] = '\0';
        peer[0x35] = '\0';
        peer[0x36] = '\0';
        peer[0x37] = '\0';
        peer[0x18] = '\0';
        peer[0x19] = '\0';
        peer[0x1a] = '\0';
        peer[0x1b] = '\0';
        peer[0x1c] = '\0';
        peer[0x1d] = '\0';
        peer[0x1e] = '\0';
        peer[0x1f] = '\0';
        peer[0x20] = '\0';
        peer[0x21] = '\0';
        peer[0x22] = '\0';
        peer[0x23] = '\0';
        peer[0x24] = '\0';
        peer[0x25] = '\0';
        peer[0x26] = '\0';
        peer[0x27] = '\0';
        peer[8] = '\0';
        peer[9] = '\0';
        peer[10] = '\0';
        peer[0xb] = '\0';
        peer[0xc] = '\0';
        peer[0xd] = '\0';
        peer[0xe] = '\0';
        peer[0xf] = '\0';
        peer[0x10] = '\0';
        peer[0x11] = '\0';
        peer[0x12] = '\0';
        peer[0x13] = '\0';
        peer[0x14] = '\0';
        peer[0x15] = '\0';
        peer[0x16] = '\0';
        peer[0x17] = '\0';
        auStack_78 = (undefined1  [8])0x0;
        peer[0] = '\0';
        peer[1] = '\0';
        peer[2] = '\0';
        peer[3] = '\0';
        peer[4] = '\0';
        peer[5] = '\0';
        peer[6] = '\0';
        peer[7] = '\0';
        iVar3 = nng_stream_get_int(*arg,"ipc:peer-pid",(int *)(peer + 0x3c));
        if (iVar3 == 0) {
          snprintf(auStack_78,0x40," from PID %lu",(long)(int)peer._60_4_);
        }
        uVar2 = *(undefined8 *)((long)arg + 0x10);
        uVar4 = nni_pipe_sock_id(*(nni_pipe **)((long)arg + 0x28));
        uVar5 = nni_pipe_id(*(nni_pipe **)((long)arg + 0x28));
        nng_log_warn("NNG-RCVMAX",
                     "Oversize message of %lu bytes (> %lu) on socket<%u> pipe<%u> from IPC%s",sz,
                     uVar2,(ulong)uVar4,(ulong)uVar5,auStack_78);
        result = NNG_EMSGSIZE;
      }
    }
  }
  pnVar6 = (nni_aio *)nni_list_first((nni_list *)((long)arg + 0x78));
  while (pnVar6 != (nni_aio *)0x0) {
    nni_aio_list_remove(pnVar6);
    nni_aio_finish_error(pnVar6,result);
    pnVar6 = (nni_aio *)nni_list_first((nni_list *)((long)arg + 0x78));
  }
  pnVar1 = *(nni_msg **)((long)arg + 0x600);
  *(undefined8 *)((long)arg + 0x600) = 0;
  nni_pipe_bump_error(*(nni_pipe **)((long)arg + 0x28),result);
  nni_mtx_unlock(mtx);
  nni_msg_free(pnVar1);
  return;
}

Assistant:

static void
ipc_pipe_recv_cb(void *arg)
{
	ipc_pipe *p = arg;
	nni_aio  *aio;
	int       rv;
	size_t    n;
	nni_msg  *msg;
	nni_aio  *rx_aio = &p->rx_aio;

	nni_mtx_lock(&p->mtx);

	if ((rv = nni_aio_result(rx_aio)) != 0) {
		// Error on receive.  This has to cause an error back
		// to the user.  Also, if we had an allocated rx_msg, lets
		// toss it.
		goto error;
	}

	n = nni_aio_count(rx_aio);
	nni_aio_iov_advance(rx_aio, n);
	if (nni_aio_iov_count(rx_aio) != 0) {
		// Was this a partial read?  If so then resubmit for the rest.
		nng_stream_recv(p->conn, rx_aio);
		nni_mtx_unlock(&p->mtx);
		return;
	}

	// If we don't have a message yet, we were reading the message
	// header, which is just the length.  This tells us the size of the
	// message to allocate and how much more to expect.
	if (p->rx_msg == NULL) {
		uint64_t len;

		// Check to make sure we got msg type 1.
		if (p->rx_head[0] != 1) {
			rv = NNG_EPROTO;
			goto error;
		}

		// We should have gotten a message header.
		NNI_GET64(p->rx_head + 1, len);

		// Make sure the message payload is not too big.  If it is
		// the caller will shut down the pipe.
		if ((len > p->rcv_max) && (p->rcv_max > 0)) {
			int  pid;
			char peer[64] = "";
			if (nng_stream_get_int(
			        p->conn, NNG_OPT_PEER_PID, &pid) == 0) {
				snprintf(peer, sizeof(peer), " from PID %lu",
				    (unsigned long) pid);
			}
			nng_log_warn("NNG-RCVMAX",
			    "Oversize message of %lu bytes (> %lu) "
			    "on socket<%u> pipe<%u> from IPC%s",
			    (unsigned long) len, (unsigned long) p->rcv_max,
			    nni_pipe_sock_id(p->pipe), nni_pipe_id(p->pipe),
			    peer);
			rv = NNG_EMSGSIZE;
			goto error;
		}

		// Note that all IO on this pipe is blocked behind this
		// allocation.  We could possibly look at using a separate
		// lock for the read side in the future, so that we allow
		// transmits to proceed normally.  In practice this is
		// unlikely to be much of an issue though.
		if ((rv = nni_msg_alloc(&p->rx_msg, (size_t) len)) != 0) {
			goto error;
		}

		if (len != 0) {
			nni_iov iov;
			// Submit the rest of the data for a read -- we want to
			// read the entire message now.
			iov.iov_buf = nni_msg_body(p->rx_msg);
			iov.iov_len = (size_t) len;

			nni_aio_set_iov(rx_aio, 1, &iov);
			nng_stream_recv(p->conn, rx_aio);
			nni_mtx_unlock(&p->mtx);
			return;
		}
	}

	// Otherwise, we got a message read completely.  Let the user know the
	// good news.

	aio = nni_list_first(&p->recv_q);
	nni_aio_list_remove(aio);
	msg       = p->rx_msg;
	p->rx_msg = NULL;
	n         = nni_msg_len(msg);
	nni_pipe_bump_rx(p->pipe, n);
	ipc_pipe_recv_start(p);
	nni_mtx_unlock(&p->mtx);

	nni_aio_set_msg(aio, msg);
	nni_aio_finish_sync(aio, 0, n);
	return;

error:
	while ((aio = nni_list_first(&p->recv_q)) != NULL) {
		nni_aio_list_remove(aio);
		nni_aio_finish_error(aio, rv);
	}
	msg       = p->rx_msg;
	p->rx_msg = NULL;
	nni_pipe_bump_error(p->pipe, rv);
	// Intentionally, we do not queue up another receive.
	// The protocol should notice this error and close the pipe.
	nni_mtx_unlock(&p->mtx);

	nni_msg_free(msg);
}